

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>,pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>>
          (string *__return_storage_ptr__,internal *this,iterator_base<false> *value,
          iterator_base<false> *param_2)

{
  iterator_base<false> *param_1_local;
  iterator_base<false> *value_local;
  
  FormatForComparison<pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>,pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>>
  ::Format_abi_cxx11_(__return_storage_ptr__,
                      (FormatForComparison<pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>,pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>>
                       *)this,value);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatForComparisonFailureMessage(
    const T1& value, const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}